

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProcessEvent>::destruct(BasicTypeInfo<dap::ProcessEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ProcessEvent> *this_local;
  
  ProcessEvent::~ProcessEvent((ProcessEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }